

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O3

Config * __thiscall QPDFJob::Config::json(Config *this,string *parameter)

{
  int iVar1;
  long *plVar2;
  size_type *psVar3;
  string local_60;
  long *local_40 [2];
  long local_30 [2];
  
  if ((parameter->_M_string_length == 0) ||
     (iVar1 = std::__cxx11::string::compare((char *)parameter), iVar1 == 0)) {
    ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    json_version = 2;
    return this;
  }
  iVar1 = QUtil::string_to_int((parameter->_M_dataplus)._M_p);
  ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  json_version = iVar1;
  if (0xfffffffd < iVar1 - 3U) {
    return this;
  }
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"unsupported json version ","")
  ;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_40,(ulong)(parameter->_M_dataplus)._M_p);
  psVar3 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3) {
    local_60.field_2._M_allocated_capacity = *psVar3;
    local_60.field_2._8_8_ = plVar2[3];
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  }
  else {
    local_60.field_2._M_allocated_capacity = *psVar3;
    local_60._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_60._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  usage(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_40[0] == local_30) {
    return this;
  }
  operator_delete(local_40[0],local_30[0] + 1);
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::json(std::string const& parameter)
{
    if (parameter.empty() || (parameter == "latest")) {
        o.m->json_version = JSON::LATEST;
    } else {
        o.m->json_version = QUtil::string_to_int(parameter.c_str());
    }
    if ((o.m->json_version < 1) || (o.m->json_version > JSON::LATEST)) {
        usage(std::string("unsupported json version ") + parameter);
    }
    return this;
}